

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_freeCCtxParams(ZSTD_CCtx_params *params)

{
  ZSTD_CCtx_params *params_local;
  
  if (params != (ZSTD_CCtx_params *)0x0) {
    ZSTD_free(params,params->customMem);
  }
  return 0;
}

Assistant:

size_t ZSTD_freeCCtxParams(ZSTD_CCtx_params* params)
{
    if (params == NULL) { return 0; }
    ZSTD_free(params, params->customMem);
    return 0;
}